

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adx.c
# Opt level: O1

ErrorNumber test_func_adx(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  TA_FuncUnstId unstId;
  uint integerTolerance;
  TA_Test_conflict2 *pTVar3;
  ulong uVar4;
  ulong uVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict2 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar3 = tableTest;
  uVar4 = 0;
  do {
    if ((int)history->nbBars < pTVar3->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_adx.c"
             ,uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    TVar1 = TA_BAD_PARAM;
    setInputBuffer(2,history->close,history->nbBars);
    setInputBuffer(3,history->high,history->nbBars);
    switch(pTVar3->id) {
    case TEST_STOCH:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_MINUS_DM,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 == TA_SUCCESS) {
        TVar1 = TA_MINUS_DM(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                            pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
        break;
      }
      goto LAB_0011545e;
    case TEST_STOCHF:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_MINUS_DI,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_MINUS_DI(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TEST_STOCHRSI:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_PLUS_DM,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_PLUS_DM(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,
                         pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_PLUS_DI:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_PLUS_DI,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_PLUS_DI(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_DX:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_DX,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_DX(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_ADX:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_ADX,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_ADX(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_ADXR:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_ADX,pTVar3->unstablePeriod);
      uVar5 = 0x8a;
      if (TVar1 != TA_SUCCESS) goto LAB_0011545e;
      TVar1 = TA_ADXR(pTVar3->startIdx,pTVar3->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                      pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 != TA_TEST_PASS))
       || (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar2 != TA_TEST_PASS)) {
LAB_0011545b:
      uVar5 = (ulong)EVar2;
      goto LAB_0011545e;
    }
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar3->expectedRetCode,outBegIdx,
                               pTVar3->expectedBegIdx,outNbElement,pTVar3->expectedNbElement,
                               pTVar3->oneOfTheExpectedOutReal0,
                               pTVar3->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) {
LAB_001154b2:
      uVar5 = (ulong)EVar2;
      printf("Fail for output id=%d\n");
      goto LAB_0011545e;
    }
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar3->id) {
    case TEST_STOCH:
      TVar1 = TA_MINUS_DM(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,
                          pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TEST_STOCHF:
      TVar1 = TA_MINUS_DI(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TEST_STOCHRSI:
      TVar1 = TA_PLUS_DM(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,
                         pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_PLUS_DI:
      TVar1 = TA_PLUS_DI(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_DX:
      TVar1 = TA_DX(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                    pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_ADX:
      TVar1 = TA_ADX(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                     pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_ADXR:
      TVar1 = TA_ADXR(pTVar3->startIdx,pTVar3->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                      pTVar3->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    default:
      TVar1 = TA_BAD_PARAM;
    }
    EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar2 != TA_TEST_PASS)
        ) || (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[3].in), EVar2 != TA_TEST_PASS))
    goto LAB_0011545b;
    EVar2 = checkExpectedValue(gBuffer[3].in,TVar1,pTVar3->expectedRetCode,outBegIdx,
                               pTVar3->expectedBegIdx,outNbElement,pTVar3->expectedNbElement,
                               pTVar3->oneOfTheExpectedOutReal0,
                               pTVar3->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) goto LAB_001154b2;
    local_48 = history->high;
    pTStack_40 = history->low;
    local_38 = history->close;
    local_50 = pTVar3;
    if (pTVar3->doRangeTestFlag == 0) goto LAB_00115783;
    switch(pTVar3->id) {
    case TEST_STOCH:
      unstId = TA_FUNC_UNST_MINUS_DM;
      goto LAB_00115747;
    case TEST_STOCHF:
      unstId = TA_FUNC_UNST_MINUS_DI;
      break;
    case TEST_STOCHRSI:
      unstId = TA_FUNC_UNST_PLUS_DM;
LAB_00115747:
      integerTolerance = 0;
      goto LAB_00115772;
    case TST_PLUS_DI:
      unstId = TA_FUNC_UNST_PLUS_DI;
      break;
    case TST_DX:
      unstId = TA_FUNC_UNST_DX;
      break;
    case TST_ADX:
    case TST_ADXR:
      unstId = TA_FUNC_UNST_ADX;
      break;
    default:
      uVar5 = 0;
      goto LAB_0011577a;
    }
    integerTolerance = 2;
LAB_00115772:
    EVar2 = doRangeTest(rangeTestFunction,unstId,&local_50,1,integerTolerance);
    uVar5 = (ulong)EVar2;
LAB_0011577a:
    if ((int)uVar5 == 0) {
LAB_00115783:
      uVar5 = 0;
    }
LAB_0011545e:
    if ((ErrorNumber)uVar5 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_adx.c"
             ,uVar4 & 0xffffffff,uVar5);
      return (ErrorNumber)uVar5;
    }
    uVar4 = uVar4 + 1;
    pTVar3 = pTVar3 + 1;
    if (uVar4 == 0x1e) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_adx( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}